

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O0

int poll_add(event_base *base,int fd,short old,short events,void *idx_)

{
  int iVar1;
  int *piVar2;
  void *pvVar3;
  int local_54;
  int tmp_event_count;
  pollfd *tmp_event_set;
  int i;
  pollidx *idx;
  pollfd *pfd;
  pollop *pop;
  void *idx__local;
  short events_local;
  short old_local;
  int fd_local;
  event_base *base_local;
  
  piVar2 = (int *)base->evbase;
  if ((events & 8U) != 0) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/poll.c"
               ,0xe0,"(events & EV_SIGNAL) == 0","poll_add");
  }
  if ((events & 6U) != 0) {
    if (*piVar2 <= piVar2[1] + 1) {
      if (*piVar2 < 0x20) {
        local_54 = 0x20;
      }
      else {
        local_54 = *piVar2 << 1;
      }
      pvVar3 = event_mm_realloc_(*(void **)(piVar2 + 4),(long)local_54 << 3);
      if (pvVar3 == (void *)0x0) {
        event_warn("realloc");
        return -1;
      }
      *(void **)(piVar2 + 4) = pvVar3;
      *piVar2 = local_54;
      piVar2[2] = 1;
    }
    if (*idx_ + -1 < 0) {
      iVar1 = piVar2[1];
      piVar2[1] = iVar1 + 1;
      idx = (pollidx *)(*(long *)(piVar2 + 4) + (long)iVar1 * 8);
      *(undefined2 *)&idx[1].idxplus1 = 0;
      idx->idxplus1 = fd;
      *(int *)idx_ = iVar1 + 1;
    }
    else {
      idx = (pollidx *)(*(long *)(piVar2 + 4) + (long)(*idx_ + -1) * 8);
    }
    *(undefined2 *)((long)&idx[1].idxplus1 + 2) = 0;
    if ((events & 4U) != 0) {
      *(ushort *)&idx[1].idxplus1 = (ushort)idx[1].idxplus1 | 4;
    }
    if ((events & 2U) != 0) {
      *(ushort *)&idx[1].idxplus1 = (ushort)idx[1].idxplus1 | 1;
    }
  }
  return 0;
}

Assistant:

static int
poll_add(struct event_base *base, int fd, short old, short events, void *idx_)
{
	struct pollop *pop = base->evbase;
	struct pollfd *pfd = NULL;
	struct pollidx *idx = idx_;
	int i;

	EVUTIL_ASSERT((events & EV_SIGNAL) == 0);
	if (!(events & (EV_READ|EV_WRITE)))
		return (0);

	poll_check_ok(pop);
	if (pop->nfds + 1 >= pop->event_count) {
		struct pollfd *tmp_event_set;
		int tmp_event_count;

		if (pop->event_count < 32)
			tmp_event_count = 32;
		else
			tmp_event_count = pop->event_count * 2;

		/* We need more file descriptors */
		tmp_event_set = mm_realloc(pop->event_set,
				 tmp_event_count * sizeof(struct pollfd));
		if (tmp_event_set == NULL) {
			event_warn("realloc");
			return (-1);
		}
		pop->event_set = tmp_event_set;

		pop->event_count = tmp_event_count;
		pop->realloc_copy = 1;
	}

	i = idx->idxplus1 - 1;

	if (i >= 0) {
		pfd = &pop->event_set[i];
	} else {
		i = pop->nfds++;
		pfd = &pop->event_set[i];
		pfd->events = 0;
		pfd->fd = fd;
		idx->idxplus1 = i + 1;
	}

	pfd->revents = 0;
	if (events & EV_WRITE)
		pfd->events |= POLLOUT;
	if (events & EV_READ)
		pfd->events |= POLLIN;
	poll_check_ok(pop);

	return (0);
}